

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O2

void set_log_dest(QPDFLogger *l,offset_in_QPDFLogger_to_subr method,qpdf_log_dest_e dest,
                 char *identifier,qpdf_log_fn_t fn,void *udata)

{
  function<void_(std::shared_ptr<Pipeline>)> fStack_68;
  _Bind<std::_Mem_fn<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>)>_(QPDFLogger_*,_std::_Placeholder<1>)>
  local_48;
  
  local_48._M_f.super__Mem_fn_base<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>),_true>._8_8_ = 0;
  local_48._M_f.super__Mem_fn_base<void_(QPDFLogger::*)(std::shared_ptr<Pipeline>),_true>._M_pmf =
       method;
  local_48._M_bound_args.super__Tuple_impl<0UL,_QPDFLogger_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_QPDFLogger_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_QPDFLogger_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_QPDFLogger_*,_std::_Placeholder<1>_>)l;
  std::function<void(std::shared_ptr<Pipeline>)>::
  function<std::_Bind<std::_Mem_fn<void(QPDFLogger::*)(std::shared_ptr<Pipeline>)>(QPDFLogger*,std::_Placeholder<1>)>,void>
            ((function<void(std::shared_ptr<Pipeline>)> *)&fStack_68,&local_48);
  set_log_dest(l,&fStack_68,dest,identifier,fn,udata);
  std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  return;
}

Assistant:

static void
set_log_dest(
    QPDFLogger* l,
    void (QPDFLogger::*method)(std::shared_ptr<Pipeline>),
    qpdf_log_dest_e dest,
    char const* identifier,
    qpdf_log_fn_t fn,
    void* udata)
{
    set_log_dest(
        l, std::bind(std::mem_fn(method), l, std::placeholders::_1), dest, identifier, fn, udata);
}